

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_test.cpp
# Opt level: O1

void __thiscall
SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock>::TestBody
          (SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock> *this)

{
  undefined8 *puVar1;
  int iVar2;
  char *in_R9;
  TypeParam mtx;
  join_thread thd;
  AssertionResult gtest_ar_;
  barrier step;
  TypeParam local_cc;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  thread local_b8;
  internal local_b0 [8];
  undefined8 *local_a8;
  undefined1 local_a0 [32];
  barrier local_80;
  
  local_80.nthread_ = 2;
  local_80.count_ = 2;
  local_80.step_ = 0;
  std::condition_variable::condition_variable(&local_80.cv_);
  local_80.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_80.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_80.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_80.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_80.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  pthread_spin_init((pthread_spinlock_t *)&local_cc,0);
  local_a0._8_8_ = &local_80;
  local_a0._0_8_ = &local_cc;
  std::thread::
  thread<SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock>::TestBody()::_lambda()_1_,,void>
            (&local_b8,(anon_class_16_2_20c777b2_for__M_head_impl *)local_a0);
  yamc::test::barrier::await(&local_80);
  iVar2 = pthread_spin_trylock((pthread_spinlock_t *)&local_cc);
  local_b0[0] = (internal)(iVar2 != 0);
  local_a8 = (undefined8 *)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_b0,(AssertionResult *)"mtx.try_lock()","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/spinlock_test.cpp"
               ,0x57,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((TypeParam *)local_a0._0_8_ != (TypeParam *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  puVar1 = local_a8;
  if (local_a8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_a8 != local_a8 + 2) {
      operator_delete((undefined8 *)*local_a8);
    }
    operator_delete(puVar1);
  }
  yamc::test::barrier::await(&local_80);
  yamc::test::join_thread::~join_thread((join_thread *)&local_b8);
  pthread_spin_destroy((pthread_spinlock_t *)&local_cc);
  std::condition_variable::~condition_variable(&local_80.cv_);
  return;
}

Assistant:

TYPED_TEST(SpinMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    EXPECT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    EXPECT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}